

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

char * __thiscall QMetaEnum::key(QMetaEnum *this,int index)

{
  QMetaObject *mo;
  long lVar1;
  qint32 qVar2;
  quint32 qVar3;
  char *pcVar4;
  int in_ESI;
  long *in_RDI;
  
  if (((*in_RDI != 0) && (-1 < in_ESI)) &&
     (qVar2 = Data::keyCount((Data *)(in_RDI + 1)), in_ESI < qVar2)) {
    mo = (QMetaObject *)*in_RDI;
    lVar1 = *(long *)(*in_RDI + 0x10);
    qVar3 = Data::data((Data *)(in_RDI + 1));
    pcVar4 = rawStringData(mo,*(int *)(lVar1 + (ulong)(qVar3 + in_ESI * 2) * 4));
    return pcVar4;
  }
  return (char *)0x0;
}

Assistant:

const char *QMetaEnum::key(int index) const
{
    if (!mobj)
        return nullptr;
    if (index >= 0  && index < int(data.keyCount()))
        return rawStringData(mobj, mobj->d.data[data.data() + 2*index]);
    return nullptr;
}